

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

overlap_iterator * __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::overlap_iterator::operator++
          (overlap_iterator *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  overlap_iterator *in_RDI;
  uint32_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
  *in_stack_00000008;
  uint32_t size;
  uint32_t offset;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint32_t uVar5;
  overlap_iterator *key;
  
  key = in_RDI;
  IntervalMapDetails::Path::leafOffset((Path *)0x7efec3);
  IntervalMapDetails::Path::leafSize((Path *)0x7efeda);
  bVar1 = const_iterator::isFlat
                    ((const_iterator *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                    );
  if (bVar1) {
    IntervalMapDetails::Path::
    leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,true>>
              ((Path *)0x7efefc);
    uVar2 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
            ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
                                *)in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                               (interval<unsigned_long> *)key);
  }
  else {
    IntervalMapDetails::Path::
    leaf<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>>
              ((Path *)0x7eff29);
    uVar2 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
            ::findFirstOverlap(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                               (interval<unsigned_long> *)key);
  }
  uVar5 = uVar2;
  puVar4 = IntervalMapDetails::Path::leafOffset((Path *)0x7eff64);
  *puVar4 = uVar2;
  uVar3 = IntervalMapDetails::Path::leafSize((Path *)0x7eff80);
  if (uVar2 == uVar3) {
    bVar1 = const_iterator::isFlat((const_iterator *)CONCAT44(uVar5,uVar2));
    if (!bVar1) {
      nextOverlap((overlap_iterator *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    }
  }
  return in_RDI;
}

Assistant:

overlap_iterator& operator++() {
        SLANG_ASSERT(valid());

        uint32_t offset = this->path.leafOffset() + 1;
        auto size = this->path.leafSize();
        offset = this->isFlat()
                     ? this->path.template leaf<RootLeaf>().findFirstOverlap(offset, size,
                                                                             searchKey)
                     : this->path.template leaf<Leaf>().findFirstOverlap(offset, size, searchKey);

        this->path.leafOffset() = offset;
        if (offset == this->path.leafSize() && !this->isFlat())
            nextOverlap();

        return *this;
    }